

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeRegListOperand(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint RegLst;
  uint i;
  uint RegNum;
  uint Regs [8];
  uint local_50;
  uint local_48 [14];
  MCInst *local_10;
  DecodeStatus local_4;
  
  local_48[0] = 0x116;
  local_48[1] = 0x117;
  local_48[2] = 0x118;
  local_48[3] = 0x119;
  local_48[4] = 0x11a;
  local_48[5] = 0x11b;
  local_48[6] = 0x11c;
  local_48[7] = 8;
  local_10 = in_RDI;
  uVar2 = fieldFromInstruction(in_ESI,0x15,5);
  if (uVar2 == 0) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    local_50 = 0;
    while( true ) {
      uVar1 = uVar2 & 0xf;
      if (7 < (uVar2 & 0xf)) {
        uVar1 = 8;
      }
      if (uVar1 <= local_50) break;
      MCOperand_CreateReg0(local_10,local_48[local_50]);
      local_50 = local_50 + 1;
    }
    if ((uVar2 & 0x10) != 0) {
      MCOperand_CreateReg0(local_10,0x13);
    }
    local_4 = MCDisassembler_Success;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	unsigned i;
	DecodeStatus S = MCDisassembler_Success;
	unsigned opcode;

	bool NeedDisjointWriteback = false;
	unsigned WritebackReg = 0;

	opcode = MCInst_getOpcode(Inst);
	switch (opcode) {
		default:
			break;
		case ARM_LDMIA_UPD:
		case ARM_LDMDB_UPD:
		case ARM_LDMIB_UPD:
		case ARM_LDMDA_UPD:
		case ARM_t2LDMIA_UPD:
		case ARM_t2LDMDB_UPD:
		case ARM_t2STMIA_UPD:
		case ARM_t2STMDB_UPD:
			NeedDisjointWriteback = true;
			WritebackReg = MCOperand_getReg(MCInst_getOperand(Inst, 0));
			break;
	}

	// Empty register lists are not allowed.
	if (Val == 0) return MCDisassembler_Fail;
	for (i = 0; i < 16; ++i) {
		if (Val & (1 << i)) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, i, Address, Decoder)))
				return MCDisassembler_Fail;
			// Writeback not allowed if Rn is in the target list.
			if (NeedDisjointWriteback && WritebackReg == MCOperand_getReg(&(Inst->Operands[Inst->size-1])))
				Check(&S, MCDisassembler_SoftFail);
		}
	}

	if (opcode == ARM_t2LDMIA_UPD && WritebackReg == ARM_SP) {
		if (Val & (1 << 13) || ((Val & (1 << 15)) && (Val & (1 << 14)))) {
			// invalid thumb2 pop
			// needs no sp in reglist and not both pc and lr set at the same time
			return MCDisassembler_Fail;
		}
	}

	return S;
}